

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::DescriptorProto_ExtensionRange::_InternalParse
          (DescriptorProto_ExtensionRange *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  uint uVar2;
  bool bVar3;
  uint64 uVar4;
  ExtensionRangeOptions *msg;
  UnknownFieldSet *unknown;
  char cVar5;
  ulong tag_00;
  uint uVar6;
  uint local_3c;
  char *pcStack_38;
  uint32 tag;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar6 = 0;
  pcStack_38 = ptr;
  do {
    while( true ) {
      bVar3 = internal::ParseContext::Done(ctx,&stack0xffffffffffffffc8);
      if (bVar3) goto LAB_002c9d20;
      pcStack_38 = internal::ReadTag(pcStack_38,&local_3c,0);
      if (pcStack_38 == (char *)0x0) goto LAB_002c9d3c;
      tag_00 = (ulong)local_3c;
      uVar2 = local_3c >> 3;
      cVar5 = (char)local_3c;
      if (uVar2 == 3) break;
      if (uVar2 == 2) {
        if (cVar5 != '\x10') goto LAB_002c9cc8;
        uVar6 = uVar6 | 4;
        uVar4 = internal::ReadVarint64(&stack0xffffffffffffffc8);
        this->end_ = (int32)uVar4;
      }
      else {
        if ((uVar2 != 1) || (cVar5 != '\b')) {
LAB_002c9cc8:
          if ((tag_00 != 0) && ((local_3c & 7) != 4)) {
            pvVar1 = this_00->ptr_;
            if (((ulong)pvVar1 & 1) == 0) {
              unknown = internal::InternalMetadata::
                        mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
            }
            else {
              unknown = (UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
            }
            pcStack_38 = internal::UnknownFieldParse(tag_00,unknown,pcStack_38,ctx);
            goto LAB_002c9cfb;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
          goto LAB_002c9d20;
        }
        uVar6 = uVar6 | 2;
        uVar4 = internal::ReadVarint64(&stack0xffffffffffffffc8);
        this->start_ = (int32)uVar4;
      }
      if (pcStack_38 == (char *)0x0) goto LAB_002c9d3c;
    }
    if (cVar5 != '\x1a') goto LAB_002c9cc8;
    msg = _internal_mutable_options(this);
    pcStack_38 = internal::ParseContext::ParseMessage<google::protobuf::ExtensionRangeOptions>
                           (ctx,msg,pcStack_38);
LAB_002c9cfb:
  } while (pcStack_38 != (char *)0x0);
LAB_002c9d3c:
  pcStack_38 = (char *)0x0;
LAB_002c9d20:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar6;
  return pcStack_38;
}

Assistant:

const char* DescriptorProto_ExtensionRange::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional int32 start = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_start(&has_bits);
          start_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 end = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_end(&has_bits);
          end_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ExtensionRangeOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}